

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroll_widgets.cpp
# Opt level: O3

void v_scroll_indicator_draw_proc(Am_Object *self,Am_Drawonable *draw,int x_offset,int y_offset)

{
  uint *puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int width;
  int height;
  Am_Value *pAVar5;
  uint uVar6;
  uint uVar7;
  Computed_Colors_Record CVar8;
  uint top;
  am_rect arrow_rect;
  Am_Widget_Look look;
  Computed_Colors_Record local_40;
  int local_34;
  
  local_34 = x_offset;
  pAVar5 = Am_Object::Get(self,100,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(self,0x65,0);
  iVar4 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(self,0x66,0);
  width = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(self,0x67,0);
  height = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(self,0xcc,0);
  bVar2 = Am_Value::operator_cast_to_bool(pAVar5);
  pAVar5 = Am_Object::Get(self,0x1ad,0);
  CVar8.data = (Computed_Colors_Record_Data *)(pAVar5->value).wrapper_value;
  if (CVar8.data != (Computed_Colors_Record_Data *)0x0) {
    puVar1 = &((CVar8.data)->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 + 1;
  }
  local_40.data = CVar8.data;
  pAVar5 = Am_Object::Get(self,0x17f,0);
  look.value = Am_MOTIF_LOOK_val;
  if ((pAVar5->type != 1) && (pAVar5->type != Am_Widget_Look::Am_Widget_Look_ID)) {
    Am_Widget_Look::TypeError(&look,pAVar5);
  }
  iVar3 = iVar3 + local_34;
  top = iVar4 + y_offset;
  look.value = *(Am_Widget_Look_vals *)&pAVar5->value;
  if (look.value == Am_MOTIF_LOOK_val) {
    Am_Draw_Motif_Box(iVar3,top,width,height,false,&local_40,draw);
    CVar8.data = local_40.data;
  }
  else if (look.value == Am_WINDOWS_LOOK_val) {
    arrow_rect.top = top;
    arrow_rect.left = iVar3;
    arrow_rect.height = height;
    arrow_rect.width = width;
    draw_win_arrow_box(arrow_rect,false,false,&local_40,draw);
  }
  else {
    if (look.value != Am_MACINTOSH_LOOK_val) {
      Am_Error("Unknown Look parameter");
    }
    if (bVar2) {
      uVar7 = iVar3 + 1;
      (*draw->_vptr_Am_Drawonable[0x2c])
                (draw,&(CVar8.data)->highlight_style,&(CVar8.data)->background_style,(ulong)uVar7,
                 (ulong)(top + 1),0xe,0xf,0);
      (*draw->_vptr_Am_Drawonable[0x2b])
                (draw,&(CVar8.data)->shadow_style,&Am_No_Style,(ulong)uVar7,(ulong)top,
                 (ulong)(iVar3 + 0xe),(ulong)top,(ulong)(iVar3 + 0xe),(ulong)(top + 0xf),
                 (ulong)uVar7,(ulong)(top + 0xf),0);
      (*draw->_vptr_Am_Drawonable[0x2c])
                (draw,&Am_No_Style,&(CVar8.data)->highlight_style,(ulong)(iVar3 + 5U),
                 (ulong)(top + 4),6,9,0);
      uVar7 = 3;
      do {
        uVar6 = top + uVar7 + 2;
        (*draw->_vptr_Am_Drawonable[0x28])
                  (draw,&(CVar8.data)->background_style,(ulong)(iVar3 + 5U),(ulong)uVar6,
                   (ulong)(iVar3 + 10),(ulong)uVar6,0);
        uVar7 = uVar7 + 2;
      } while (uVar7 < 10);
    }
  }
  if (CVar8.data != (Computed_Colors_Record_Data *)0x0) {
    puVar1 = &((CVar8.data)->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      (*((CVar8.data)->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[4])
                (CVar8.data);
    }
  }
  return;
}

Assistant:

Am_Define_Method(Am_Draw_Method, void, v_scroll_indicator_draw,
                 (Am_Object self, Am_Drawonable *draw, int x_offset,
                  int y_offset))
{
  int left = (int)self.Get(Am_LEFT) + x_offset;
  int top = (int)self.Get(Am_TOP) + y_offset;
  int width = self.Get(Am_WIDTH);
  int height = self.Get(Am_HEIGHT);
  bool active = self.Get(Am_ACTIVE);
  Computed_Colors_Record color_rec = self.Get(Am_STYLE_RECORD);
  Am_Widget_Look look = self.Get(Am_WIDGET_LOOK);

  switch (look.value) {
  case Am_MOTIF_LOOK_val:
    Am_Draw_Motif_Box(left, top, width, height, false, color_rec, draw);
    break;

  case Am_WINDOWS_LOOK_val: {
    am_rect r(left, top, width, height);
    draw_win_arrow_box(r, false, false, color_rec, draw);
  } break;

  case Am_MACINTOSH_LOOK_val:
    if (active) {
      draw->Draw_Rectangle(color_rec.data->highlight_style,
                           color_rec.data->background_style, left + 1, top + 1,
                           14, 15);
      draw->Draw_3_Lines(color_rec.data->shadow_style, Am_No_Style, left + 1,
                         top, left + 14, top, left + 14, top + 15, left + 1,
                         top + 15);
      draw->Draw_Rectangle(Am_No_Style, color_rec.data->highlight_style,
                           left + 5, top + 4, 6, 9);
      for (int y = 5; y <= 11; y += 2)
        draw->Draw_Line(color_rec.data->background_style, left + 5, top + y,
                        left + 10, top + y);
    }
    break;

  default:
    Am_Error("Unknown Look parameter");
    break;
  }
}